

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  ptls_buffer_t *ppVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  byte bVar4;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var5;
  st_ptls_get_time_t *psVar6;
  st_ptls_verify_certificate_t *psVar7;
  st_ptls_save_ticket_t *psVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ptls_key_exchange_context_t *ppVar12;
  void *pvVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ptls_iovec_t nonce;
  short sVar16;
  byte bVar17;
  ushort uVar18;
  ushort uVar19;
  uint uVar20;
  anon_enum_32 aVar21;
  uint8_t *puVar22;
  uint64_t uVar23;
  uint8_t *puVar24;
  char *pcVar25;
  ushort *puVar26;
  uint8_t *puVar27;
  ushort *puVar28;
  ulong uVar29;
  size_t delta;
  ptls_hash_context_t **pppVar30;
  size_t sVar31;
  ulong uVar32;
  uint8_t *puVar33;
  ptls_cipher_suite_t *cs;
  st_ptls_early_data_t *psVar34;
  ushort *puVar35;
  ushort *puVar36;
  long lVar37;
  st_ptls_key_schedule_t *psVar38;
  size_t sVar39;
  ptls_cipher_suite_t **pppVar40;
  ptls_buffer_t *ppVar41;
  uint8_t *puVar42;
  ulong uVar43;
  size_t sVar44;
  size_t sVar45;
  uint8_t uVar46;
  uint8_t *puVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ptls_iovec_t message;
  ptls_iovec_t pVar53;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar54;
  ptls_iovec_t message_01;
  ptls_iovec_t pVar55;
  ptls_iovec_t message_02;
  uint32_t ticket_lifetime;
  size_t mess_start;
  ptls_iovec_t ticket_nonce;
  uint32_t max_early_data_size;
  uint32_t ticket_age_add;
  ptls_iovec_t ticket;
  uint local_330;
  ushort local_2fa;
  ptls_iovec_t local_2f8;
  size_t local_2e8;
  int local_2e0;
  uint8_t *local_2d0;
  ptls_buffer_t *local_2c8;
  uint8_t *local_2c0;
  undefined1 local_2b8 [8];
  uint8_t *puStack_2b0;
  uint8_t *local_2a8;
  size_t local_298;
  anon_union_64_2_21cbdc79_for_st_ptls_t_19 *local_290;
  ptls_buffer_t *local_288;
  st_ptls_traffic_protection_t *local_280;
  void **local_278;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **local_270;
  ptls_iovec_t local_268;
  undefined8 *local_258;
  uint32_t local_250;
  uint32_t local_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  uint8_t *puStack_230;
  undefined1 local_228 [16];
  ptls_iovec_t local_218;
  undefined1 local_208 [8];
  uint8_t *apuStack_200 [58];
  
  auVar49 = _local_2b8;
  ppVar41 = &(tls->recvbuf).rec;
  puVar42 = (tls->recvbuf).rec.base;
  puVar47 = (uint8_t *)*inlen;
  if (puVar47 < (uint8_t *)0x5 || puVar42 != (uint8_t *)0x0) {
    _local_2b8 = (undefined1  [16])0x0;
    local_2a8 = (uint8_t *)0x0;
    if (puVar42 == (uint8_t *)0x0) goto LAB_0019bffe;
LAB_0019c05c:
    auVar49 = _local_2b8;
    puVar47 = puVar47 + (long)input;
    puVar22 = (uint8_t *)(tls->recvbuf).rec.off;
    while (puVar22 < (uint8_t *)0x5) {
      if ((uint8_t *)input == puVar47) {
        return 0x202;
      }
      uVar46 = *input;
      input = (void *)((long)input + 1);
      puVar42 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = (size_t)(puVar22 + 1);
      puVar22[(long)puVar42] = uVar46;
      puVar22 = (uint8_t *)(tls->recvbuf).rec.off;
    }
    puVar42 = (((anon_struct_64_2_7cec4369_for_recvbuf *)ppVar41)->rec).base;
    uVar46 = *puVar42;
    local_2b8[0] = uVar46;
    auVar48 = _local_2b8;
    stack0xfffffffffffffd4c = auVar49._4_12_;
    local_2b8._0_2_ = auVar48._0_2_;
    local_2b8._2_2_ = *(ushort *)(puVar42 + 1) << 8 | *(ushort *)(puVar42 + 1) >> 8;
    uVar18 = *(ushort *)(puVar42 + 3) << 8 | *(ushort *)(puVar42 + 3) >> 8;
    puVar42 = (uint8_t *)(ulong)uVar18;
    puStack_2b0._0_2_ = uVar18;
    puStack_2b0._2_6_ = 0;
    if ((ushort)((uVar46 == '\x17' | 0x40) << 8) < uVar18) {
      return 0x32;
    }
    puVar24 = puVar42 + 5;
    uVar32 = (long)puVar24 - (long)puVar22;
    if (uVar32 != 0) {
      local_2c8 = ppVar41;
      uVar20 = ptls_buffer_reserve(ppVar41,uVar32);
      if (uVar20 != 0) {
        return uVar20;
      }
      uVar43 = (long)puVar47 - (long)input;
      if (uVar32 < (ulong)((long)puVar47 - (long)input)) {
        uVar43 = uVar32;
      }
      puVar22 = (uint8_t *)(tls->recvbuf).rec.off;
      ppVar41 = local_2c8;
      local_2c0 = puVar42;
      if (uVar43 != 0) {
        memcpy(puVar22 + (long)(tls->recvbuf).rec.base,input,uVar43);
        input = (void *)((long)input + uVar43);
        puVar22 = (uint8_t *)(uVar43 + (tls->recvbuf).rec.off);
        (tls->recvbuf).rec.off = (size_t)puVar22;
        ppVar41 = local_2c8;
        puVar42 = local_2c0;
      }
    }
    if (puVar22 != puVar24) {
      *inlen = (size_t)((long)input + (*inlen - (long)puVar47));
      return 0x202;
    }
    puVar24 = ((ptls_buffer_t *)&ppVar41->base)->base + 5;
    puVar22 = (uint8_t *)((long)input + (*inlen - (long)puVar47));
  }
  else {
    uVar46 = *input;
    local_2b8[0] = uVar46;
    auVar48 = _local_2b8;
    stack0xfffffffffffffd4c = auVar49._4_12_;
    local_2b8._0_2_ = auVar48._0_2_;
    local_2b8._2_2_ = *(ushort *)((long)input + 1) << 8 | *(ushort *)((long)input + 1) >> 8;
    uVar18 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
    puVar42 = (uint8_t *)(ulong)uVar18;
    puStack_2b0._0_2_ = uVar18;
    puStack_2b0._2_6_ = 0;
    if ((ushort)((uVar46 == '\x17' | 0x40) << 8) < uVar18) {
      return 0x32;
    }
    puVar22 = puVar42 + 5;
    if (puVar47 < puVar22) {
LAB_0019bffe:
      local_2a8 = (uint8_t *)0x0;
      _local_2b8 = (undefined1  [16])0x0;
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      uVar20 = ptls_buffer_reserve(ppVar41,5);
      if (uVar20 != 0) {
        return uVar20;
      }
      goto LAB_0019c05c;
    }
    puVar24 = (uint8_t *)((long)input + 5);
  }
  *inlen = (size_t)puVar22;
  local_2a8 = puVar24;
  if (uVar46 == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if ((int)puVar42 != 1) {
      return 0x2f;
    }
    local_330 = 0x202;
    if (*puVar24 != '\x01') {
      return 0x2f;
    }
  }
  else {
    if ((uVar46 == '\x15') || ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
      if (uVar46 == '\x17') {
        uVar46 = '\x17';
        local_330 = 0x202;
        if ((tls->field_0x138 & 4) != 0) goto LAB_0019dde2;
      }
    }
    else {
      if (uVar46 != '\x17') {
        return 0x28;
      }
      uVar20 = ptls_buffer_reserve(decryptbuf,(size_t)(puVar42 + 5));
      if (uVar20 != 0) {
        return uVar20;
      }
      uVar20 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,
                            (size_t *)(local_2b8 + 8),puVar24,(size_t)puVar42);
      if (uVar20 != 0) {
        local_330 = 0x202;
        if ((tls->field_0x138 & 4) == 0) {
          return uVar20;
        }
        goto LAB_0019dde2;
      }
      puVar42 = puStack_2b0;
      do {
        if (puVar42 == (uint8_t *)0x0) {
          return 10;
        }
        puVar42 = puVar42 + -1;
        uVar46 = (decryptbuf->base + decryptbuf->off)[(long)puVar42];
      } while (uVar46 == '\0');
      puStack_2b0 = puVar42;
      local_2b8[0] = uVar46;
      local_2a8 = decryptbuf->base + decryptbuf->off;
    }
    puVar22 = local_2a8;
    puVar47 = (tls->recvbuf).mess.base;
    if ((puVar47 == (uint8_t *)0x0) && (uVar46 != '\x16')) {
      if (uVar46 == '\x15') {
        local_330 = 0x32;
        if (puVar42 == (uint8_t *)0x2) {
          uVar20 = local_2a8[1] | 0x100;
          local_330 = 0;
          if (local_2a8[1] != 0x5a) {
            local_330 = uVar20;
          }
          if (*local_2a8 != '\x01') {
            local_330 = uVar20;
          }
        }
      }
      else {
        local_330 = 10;
        if (uVar46 == '\x17') {
          if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
            if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
               (local_330 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
              decryptbuf->off = (size_t)(puVar42 + decryptbuf->off);
            }
          }
          else {
            decryptbuf->off = (size_t)(puVar42 + decryptbuf->off);
            local_330 = 0;
          }
        }
      }
    }
    else {
      local_330 = 0x32;
      if (uVar46 == '\x16') {
        ppVar1 = &(tls->recvbuf).mess;
        if (puVar47 == (uint8_t *)0x0) {
          local_2c0 = puVar42 + (long)local_2a8;
          puVar47 = local_2a8;
        }
        else {
          local_330 = ptls_buffer_reserve(ppVar1,(size_t)puVar42);
          if (local_330 != 0) goto LAB_0019dde2;
          memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,puVar22,(size_t)puVar42);
          sVar39 = (tls->recvbuf).mess.off;
          (tls->recvbuf).mess.off = (size_t)(puVar42 + sVar39);
          puVar47 = (tls->recvbuf).mess.base;
          local_2c0 = puVar42 + sVar39 + (long)puVar47;
        }
        uVar32 = (long)local_2c0 - (long)puVar47;
        local_330 = 0x202;
        local_2c8 = ppVar41;
        local_288 = ppVar1;
        if (3 < (long)uVar32) {
          uVar43 = (ulong)((uint)puVar47[2] << 8 | (uint)puVar47[1] << 0x10);
          sVar39 = uVar43 + puVar47[3] + 4;
          if (sVar39 <= uVar32) {
            uVar43 = uVar43 | puVar47[3];
            local_290 = &tls->field_15;
            local_280 = &(tls->traffic_protection).enc;
            local_270 = (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **)
                        ((long)&tls->field_15 + 0x18);
            local_278 = &(tls->field_15).client.certificate_verify.verify_ctx;
            local_258 = (undefined8 *)((long)&tls->field_15 + 0x10);
            local_248._8_4_ = 0x80000000;
            local_248._0_8_ = 0x8000000080000000;
            local_248._12_4_ = 0x80000000;
LAB_0019c555:
            uVar20 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
            if (0xb < uVar20) {
              __assert_fail("!\"unexpected state\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                            ,0xc85,
                            "int handle_handshake_message(ptls_t *, ptls_buffer_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                           );
            }
            uVar46 = *puVar47;
            local_330 = 10;
            switch(tls->state) {
            default:
              if ((uVar32 != sVar39) || (uVar46 != '\x02')) break;
              local_2f8.base = (uint8_t *)0x0;
              local_2f8.len = 0;
              local_238 = (undefined1  [8])0x0;
              puStack_230 = (uint8_t *)0x0;
              local_228 = (undefined1  [16])0x0;
              local_218.base = (uint8_t *)0x0;
              local_218.len = 0;
              _local_208 = (undefined1  [16])0x0;
              apuStack_200[1] = (uint8_t *)0x0;
              local_330 = 0x32;
              if (uVar43 < 0x22) goto LAB_0019d6db;
              auVar48[0] = -(puVar47[6] == 0xcf);
              auVar48[1] = -(puVar47[7] == '!');
              auVar48[2] = -(puVar47[8] == 0xad);
              auVar48[3] = -(puVar47[9] == 't');
              auVar48[4] = -(puVar47[10] == 0xe5);
              auVar48[5] = -(puVar47[0xb] == 0x9a);
              auVar48[6] = -(puVar47[0xc] == 'a');
              auVar48[7] = -(puVar47[0xd] == '\x11');
              auVar48[8] = -(puVar47[0xe] == 0xbe);
              auVar48[9] = -(puVar47[0xf] == '\x1d');
              auVar48[10] = -(puVar47[0x10] == 0x8c);
              auVar48[0xb] = -(puVar47[0x11] == '\x02');
              auVar48[0xc] = -(puVar47[0x12] == '\x1e');
              auVar48[0xd] = -(puVar47[0x13] == 'e');
              auVar48[0xe] = -(puVar47[0x14] == 0xb8);
              auVar48[0xf] = -(puVar47[0x15] == 0x91);
              auVar50[0] = -(puVar47[0x16] == 0xc2);
              auVar50[1] = -(puVar47[0x17] == 0xa2);
              auVar50[2] = -(puVar47[0x18] == '\x11');
              auVar50[3] = -(puVar47[0x19] == '\x16');
              auVar50[4] = -(puVar47[0x1a] == 'z');
              auVar50[5] = -(puVar47[0x1b] == 0xbb);
              auVar50[6] = -(puVar47[0x1c] == 0x8c);
              auVar50[7] = -(puVar47[0x1d] == '^');
              auVar50[8] = -(puVar47[0x1e] == '\a');
              auVar50[9] = -(puVar47[0x1f] == 0x9e);
              auVar50[10] = -(puVar47[0x20] == '\t');
              auVar50[0xb] = -(puVar47[0x21] == 0xe2);
              auVar50[0xc] = -(puVar47[0x22] == 200);
              auVar50[0xd] = -(puVar47[0x23] == 0xa8);
              auVar50[0xe] = -(puVar47[0x24] == '3');
              auVar50[0xf] = -(puVar47[0x25] == 0x9c);
              auVar50 = auVar50 & auVar48;
              local_208[0] = (ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar50[0xf] >> 7) << 0xf) == 0xffff;
              bVar9 = !(bool)local_208[0];
              local_208._1_3_ = 0;
              stack0xfffffffffffffdfc = SUB1612((undefined1  [16])0x0,4);
              if (sVar39 == 0x26) {
LAB_0019c61a:
                local_330 = 0x32;
              }
              else {
                bVar17 = puVar47[0x26];
                uVar32 = (ulong)bVar17;
                if (0x20 < uVar32) goto LAB_0019c61a;
                local_330 = 0x32;
                if (uVar32 <= uVar43 - 0x23) {
                  puVar42 = puVar47 + sVar39;
                  local_218.base = puVar47 + 0x27;
                  local_218.len._0_1_ = bVar17;
                  local_218.len._1_7_ = 0;
                  if (1 < (long)puVar42 - (long)(puVar47 + uVar32 + 0x27)) {
                    pppVar40 = tls->ctx->cipher_suites;
                    cs = *pppVar40;
                    if (cs != (ptls_cipher_suite_t *)0x0) {
                      uVar18 = *(ushort *)(puVar47 + uVar32 + 0x27);
                      do {
                        pppVar40 = pppVar40 + 1;
                        if (cs->id == (uint16_t)(uVar18 << 8 | uVar18 >> 8)) {
                          tls->cipher_suite = cs;
                          if ((puVar47 + uVar32 + 0x29 == puVar42) ||
                             (puVar47[uVar32 + 0x29] != '\0')) goto LAB_0019cf57;
                          if (!bVar9) {
                            apuStack_200[0]._0_2_ = 0xffff;
                            apuStack_200[0]._2_6_ = 0;
                          }
                          local_268.base = (uint8_t *)0x240000012421;
                          if ((ulong)((long)puVar42 - (long)(puVar47 + uVar32 + 0x2a)) < 2)
                          goto LAB_0019d33a;
                          uVar43 = (ulong)(ushort)(*(ushort *)(puVar47 + uVar32 + 0x2a) << 8 |
                                                  *(ushort *)(puVar47 + uVar32 + 0x2a) >> 8);
                          puVar22 = puVar47 + uVar32 + 0x2c;
                          if ((ulong)((long)puVar42 - (long)puVar22) < uVar43) goto LAB_0019d33a;
                          puVar24 = puVar22 + uVar43;
                          local_298 = CONCAT62(local_298._2_6_,0xffff);
                          sVar44 = 0;
                          local_2d0 = (uint8_t *)0x0;
                          local_2fa = 0xffff;
                          goto LAB_0019d75f;
                        }
                        cs = *pppVar40;
                      } while (cs != (ptls_cipher_suite_t *)0x0);
                    }
                    tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
                    local_330 = 0x2f;
                  }
                }
              }
              goto LAB_0019c622;
            case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
              if (uVar46 != '\b') break;
              local_238._0_2_ = 0xffff;
              local_2f8.base = (uint8_t *)0x83a0000002020;
              local_330 = 0x32;
              if ((((uint)sVar39 & 0x1fffffe) != 4) &&
                 (uVar32 = (ulong)(ushort)(*(ushort *)(puVar47 + 4) << 8 |
                                          *(ushort *)(puVar47 + 4) >> 8), local_330 = 0x32,
                 uVar32 <= uVar43 - 2)) {
                puVar42 = puVar47 + 6;
                if (uVar32 == 0) {
                  bVar9 = true;
                  puVar22 = puVar42;
                }
                else {
                  puVar22 = puVar42 + uVar32;
                  bVar9 = true;
                  do {
                    local_330 = 0x32;
                    if ((long)puVar22 - (long)puVar42 < 2) goto LAB_0019d6db;
                    uVar46 = *puVar42;
                    bVar17 = puVar42[1];
                    uVar18 = CONCAT11(uVar46,bVar17);
                    if (uVar18 < 0x40) {
                      if ((*(byte *)((long)&((ptls_buffer_t *)&local_2f8)->base +
                                    (ulong)(uVar18 >> 3)) >> (uVar18 & 7) & 1) == 0) {
                        pbVar3 = (byte *)((long)&((ptls_buffer_t *)&local_2f8)->base +
                                         (ulong)(bVar17 >> 3));
                        *pbVar3 = *pbVar3 | '\x01' << (bVar17 & 7);
                        goto LAB_0019c7ba;
                      }
LAB_0019d257:
                      local_330 = 0x2f;
                      goto LAB_0019d6db;
                    }
LAB_0019c7ba:
                    if ((ulong)((long)puVar22 - (long)(puVar42 + 2)) < 2) goto LAB_0019d6db;
                    uVar19 = *(ushort *)(puVar42 + 2) << 8 | *(ushort *)(puVar42 + 2) >> 8;
                    uVar32 = (ulong)uVar19;
                    if ((ulong)((long)puVar22 - (long)(puVar42 + 4)) < uVar32) goto LAB_0019d6db;
                    puVar24 = puVar42 + uVar32 + 4;
                    if (uVar18 == 0x2a) {
                      bVar9 = false;
                      psVar34 = tls->early_data;
joined_r0x0019c8d2:
                      if (psVar34 == (st_ptls_early_data_t *)0x0) goto LAB_0019d257;
                    }
                    else {
                      sVar16 = CONCAT11(uVar46,bVar17);
                      if (sVar16 == 0x10) {
                        if (1 < uVar19) {
                          uVar32 = (ulong)(ushort)(*(ushort *)(puVar42 + 4) << 8 |
                                                  *(ushort *)(puVar42 + 4) >> 8);
                          if (uVar32 <= (ulong)((long)puVar24 - (long)(puVar42 + 6))) {
                            if (uVar32 != 0) {
                              puVar33 = puVar42 + 6 + uVar32;
                              uVar32 = (ulong)puVar42[6];
                              puVar42 = puVar42 + 7;
                              if (uVar32 <= (ulong)((long)puVar33 - (long)puVar42)) {
                                local_330 = ptls_set_negotiated_protocol(tls,(char *)puVar42,uVar32)
                                ;
                                if (local_330 == 0) {
                                  if (puVar42 + uVar32 == puVar33) {
                                    local_330 = 0x32;
                                    if (puVar33 == puVar24) goto LAB_0019c905;
                                  }
                                  else {
                                    local_330 = 0x28;
                                  }
                                }
                                goto LAB_0019d6db;
                              }
                            }
                            local_330 = 0x32;
                          }
                        }
                        goto LAB_0019d6db;
                      }
                      if (sVar16 == 0) {
                        if (uVar32 == 0) {
                          psVar34 = (st_ptls_early_data_t *)tls->server_name;
                          goto joined_r0x0019c8d2;
                        }
                        goto LAB_0019d6db;
                      }
                      handle_unknown_extension
                                (tls,properties,uVar18,puVar42 + 4,puVar24,
                                 (ptls_raw_extension_t *)local_238);
                    }
LAB_0019c905:
                    puVar42 = puVar24;
                  } while (puVar24 != puVar22);
                }
                local_330 = 0x32;
                if (puVar22 == puVar47 + sVar39) {
                  psVar34 = tls->early_data;
                  if (psVar34 == (st_ptls_early_data_t *)0x0) {
                    local_330 = setup_traffic_protection
                                          (tls,1,"c hs traffic","CLIENT_HANDSHAKE_TRAFFIC_SECRET");
                  }
                  else {
                    tls->field_0x138 = tls->field_0x138 & 0xfb | bVar9 * '\x04';
                    if (!bVar9 && properties != (ptls_handshake_properties_t *)0x0) {
                      puVar42 = (properties->field_0).server.selected_psk_binder.base + 0x28;
                      *puVar42 = *puVar42 | 1;
                      psVar34 = tls->early_data;
                    }
                    local_330 = derive_secret(tls->key_schedule,psVar34,"c hs traffic");
                  }
                  if ((local_330 == 0) &&
                     (local_330 = report_unknown_extensions
                                            (tls,properties,(ptls_raw_extension_t *)local_238),
                     local_330 == 0)) {
                    psVar38 = tls->key_schedule;
                    if (psVar38->num_hashes != 0) {
                      pppVar30 = &psVar38->hashes[0].ctx;
                      sVar44 = 0;
                      do {
                        (*(*pppVar30)->update)(*pppVar30,puVar47,sVar39);
                        sVar44 = sVar44 + 1;
                        pppVar30 = pppVar30 + 2;
                      } while (sVar44 != psVar38->num_hashes);
                    }
                    tls->state = (byte)tls->field_0x138 &
                                 PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO |
                                 PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
                    local_330 = 0x202;
                  }
                }
              }
              goto LAB_0019d6db;
            case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
              if (uVar46 == '\v') {
                if ((uVar43 == 0) || (uVar43 - 1 < (ulong)puVar47[4])) {
LAB_0019ca93:
                  local_330 = 0x32;
                }
                else {
                  local_330 = 0x2f;
                  if (puVar47[4] == 0) {
                    if (uVar43 < 4) goto LAB_0019ca93;
                    lVar37 = 5;
                    uVar32 = 0;
                    do {
                      uVar32 = (ulong)puVar47[lVar37] | uVar32 << 8;
                      lVar37 = lVar37 + 1;
                    } while (lVar37 != 8);
                    if (uVar43 - 4 < uVar32) {
                      local_330 = 0x32;
                    }
                    else {
                      puVar36 = (ushort *)(puVar47 + 8);
                      puVar28 = (ushort *)(puVar47 + uVar32 + 8);
                      uVar32 = 0;
                      do {
                        if ((ulong)((long)puVar28 - (long)puVar36) < 3) {
LAB_0019d6b8:
                          local_330 = 0x32;
                          goto LAB_0019d6db;
                        }
                        lVar37 = 0;
                        uVar43 = 0;
                        do {
                          uVar43 = (ulong)*(byte *)((long)puVar36 + lVar37) | uVar43 << 8;
                          lVar37 = lVar37 + 1;
                        } while (lVar37 != 3);
                        pcVar25 = (char *)((long)puVar36 + 3);
                        if ((ulong)((long)puVar28 - (long)pcVar25) < uVar43) goto LAB_0019d6b8;
                        sVar44 = uVar32;
                        if (uVar32 < 0x10) {
                          sVar44 = uVar32 + 1;
                          *(char **)(local_238 + uVar32 * 0x10) = pcVar25;
                          *(ulong *)(local_238 + uVar32 * 0x10 + 8) = uVar43;
                        }
                        puVar26 = (ushort *)(pcVar25 + uVar43);
                        local_2f8.base = (uint8_t *)0x83e0000012401;
                        local_330 = 0x32;
                        if ((ulong)((long)puVar28 - (long)puVar26) < 2) goto LAB_0019d6db;
                        puVar35 = puVar26 + 1;
                        uVar32 = (ulong)(ushort)(*puVar26 << 8 | *puVar26 >> 8);
                        if ((ulong)((long)puVar28 - (long)puVar35) < uVar32) goto LAB_0019d6db;
                        puVar36 = puVar35;
                        if (uVar32 != 0) {
                          puVar36 = (ushort *)((long)puVar26 + uVar32 + 2);
                          do {
                            if ((long)puVar36 - (long)puVar35 < 2) goto LAB_0019d6db;
                            bVar17 = *(byte *)((long)puVar35 + 1);
                            uVar18 = CONCAT11((char)*puVar35,bVar17);
                            if (uVar18 < 0x40) {
                              if ((*(byte *)((long)&((ptls_buffer_t *)&local_2f8)->base +
                                            (ulong)(uVar18 >> 3)) >> (uVar18 & 7) & 1) != 0) {
                                local_330 = 0x2f;
                                goto LAB_0019d6db;
                              }
                              pbVar3 = (byte *)((long)&((ptls_buffer_t *)&local_2f8)->base +
                                               (ulong)(bVar17 >> 3));
                              *pbVar3 = *pbVar3 | '\x01' << (bVar17 & 7);
                            }
                            if ((ulong)((long)puVar36 - (long)(puVar35 + 1)) < 2) goto LAB_0019d6db;
                            uVar32 = (ulong)(ushort)(puVar35[1] << 8 | puVar35[1] >> 8);
                            if ((ulong)((long)puVar36 - (long)(puVar35 + 2)) < uVar32)
                            goto LAB_0019d6db;
                            puVar35 = (ushort *)((long)(puVar35 + 2) + uVar32);
                          } while (puVar35 != puVar36);
                        }
                        uVar32 = sVar44;
                      } while (puVar36 != puVar28);
                      local_330 = 0x32;
                      if ((puVar28 == (ushort *)(puVar47 + sVar39)) &&
                         ((psVar7 = tls->ctx->verify_certificate,
                          psVar7 == (st_ptls_verify_certificate_t *)0x0 ||
                          (local_330 = (*psVar7->cb)(psVar7,tls,local_270,local_278,
                                                     (ptls_iovec_t *)local_238,sVar44),
                          local_330 == 0)))) {
                        psVar38 = tls->key_schedule;
                        if (psVar38->num_hashes != 0) {
                          pppVar30 = &psVar38->hashes[0].ctx;
                          sVar44 = 0;
                          do {
                            (*(*pppVar30)->update)(*pppVar30,puVar47,sVar39);
                            sVar44 = sVar44 + 1;
                            pppVar30 = pppVar30 + 2;
                          } while (sVar44 != psVar38->num_hashes);
                        }
                        tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                        local_330 = 0x202;
                      }
                    }
                  }
                }
                goto LAB_0019d6db;
              }
              break;
            case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
              if (uVar46 == '\x0f') {
                local_330 = 0x32;
                if ((1 < uVar43) && (((uint)sVar39 & 0x1fffffe) != 6)) {
                  uVar18 = *(ushort *)(puVar47 + 6) << 8 | *(ushort *)(puVar47 + 6) >> 8;
                  if ((((ulong)uVar18 <= uVar43 - 4) &&
                      (puVar47 + (ulong)uVar18 + 8 == puVar47 + sVar39)) &&
                     ((uVar19 = *(ushort *)(puVar47 + 4) << 8 | *(ushort *)(puVar47 + 4) >> 8,
                      uVar19 == 0x804 || (local_330 = 0x2f, uVar19 == 0x403)))) {
                    sVar44 = build_certificate_verify_signdata
                                       (local_238,tls->key_schedule,
                                        (char *)((long)&switchD_0019c577::switchdataD_002313e0 +
                                                (long)(int)(&switchD_0019c577::switchdataD_002313e0)
                                                           [uVar20]));
                    p_Var5 = (tls->field_15).client.certificate_verify.cb;
                    if (p_Var5 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
                      local_330 = 0;
                    }
                    else {
                      pVar54.len = sVar44;
                      pVar54.base = local_238;
                      pVar55.len._0_2_ = uVar18;
                      pVar55.base = puVar47 + 8;
                      pVar55.len._2_6_ = 0;
                      local_330 = (*p_Var5)(*local_278,pVar54,pVar55);
                    }
                    (*ptls_clear_memory)(local_238,sVar44);
                    *local_270 = (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
                    if (local_330 == 0) {
                      psVar38 = tls->key_schedule;
                      if (psVar38->num_hashes != 0) {
                        pppVar30 = &psVar38->hashes[0].ctx;
                        sVar44 = 0;
                        do {
                          (*(*pppVar30)->update)(*pppVar30,puVar47,sVar39);
                          sVar44 = sVar44 + 1;
                          pppVar30 = pppVar30 + 2;
                        } while (sVar44 != psVar38->num_hashes);
                      }
                      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
                      local_330 = 0x202;
                    }
                  }
                }
                goto LAB_0019d6db;
              }
              break;
            case PTLS_STATE_CLIENT_EXPECT_FINISHED:
              if ((uVar32 == sVar39) && (uVar46 == '\x14')) {
                message_01.len = sVar39;
                message_01.base = puVar47;
                local_330 = verify_finished(tls,message_01);
                if (local_330 == 0) {
                  psVar38 = tls->key_schedule;
                  if (psVar38->num_hashes != 0) {
                    pppVar30 = &psVar38->hashes[0].ctx;
                    sVar44 = 0;
                    do {
                      (*(*pppVar30)->update)(*pppVar30,puVar47,sVar39);
                      sVar44 = sVar44 + 1;
                      pppVar30 = pppVar30 + 2;
                    } while (sVar44 != psVar38->num_hashes);
                    psVar38 = tls->key_schedule;
                  }
                  local_330 = key_schedule_extract(psVar38,(ptls_iovec_t)ZEXT816(0));
                  if ((((local_330 == 0) &&
                       (local_330 = setup_traffic_protection
                                              (tls,0,"s ap traffic","SERVER_TRAFFIC_SECRET_0"),
                       local_330 == 0)) &&
                      (local_330 = derive_secret(tls->key_schedule,local_238,"c ap traffic"),
                      local_330 == 0)) &&
                     (local_330 = derive_exporter_secret(tls,0), local_330 == 0)) {
                    if (tls->early_data == (st_ptls_early_data_t *)0x0) {
LAB_0019d534:
                      local_330 = push_change_cipher_spec(tls,sendbuf);
                      if (local_330 == 0) {
                        send_finished(tls,sendbuf);
                        *(undefined1 (*) [8])(local_280->secret + 0x30) = local_208;
                        *(uint8_t **)(local_280->secret + 0x38) = apuStack_200[0];
                        *(uint8_t **)(local_280->secret + 0x20) = local_218.base;
                        *(size_t *)(local_280->secret + 0x28) = local_218.len;
                        *(undefined8 *)(local_280->secret + 0x10) = local_228._0_8_;
                        *(undefined8 *)(local_280->secret + 0x18) = local_228._8_8_;
                        *(undefined1 (*) [8])local_280->secret = local_238;
                        *(uint8_t **)(local_280->secret + 8) = puStack_230;
                        local_330 = setup_traffic_protection
                                              (tls,1,(char *)0x0,"CLIENT_TRAFFIC_SECRET_0");
                        if (local_330 == 0) {
                          tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
                          local_330 = 0;
                        }
                      }
                    }
                    else {
                      if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
                        __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                                      ,0x782,
                                      "int client_handle_finished(ptls_t *, ptls_buffer_t *, ptls_iovec_t)"
                                     );
                      }
                      if ((tls->field_0x138 & 4) == 0) {
                        sVar44 = sendbuf->off;
                        local_330 = ptls_buffer_reserve(sendbuf,3);
                        if (local_330 == 0) {
                          puVar22 = sendbuf->base;
                          sVar45 = sendbuf->off;
                          puVar42 = puVar22 + sVar45;
                          puVar42[0] = '\x16';
                          puVar42[1] = '\x03';
                          puVar22[sVar45 + 2] = '\x03';
                          sendbuf->off = sendbuf->off + 3;
                          local_330 = ptls_buffer_reserve(sendbuf,2);
                          if (local_330 == 0) {
                            puVar42 = sendbuf->base;
                            sVar45 = sendbuf->off;
                            (puVar42 + sVar45)[0] = '\0';
                            (puVar42 + sVar45)[1] = '\0';
                            local_298 = sendbuf->off;
                            local_2d0 = (uint8_t *)(local_298 + 2);
                            sendbuf->off = (size_t)local_2d0;
                            local_330 = ptls_buffer_reserve(sendbuf,1);
                            if (local_330 == 0) {
                              sendbuf->base[sendbuf->off] = '\x05';
                              sendbuf->off = sendbuf->off + 1;
                              local_330 = ptls_buffer_reserve(sendbuf,3);
                              if (local_330 == 0) {
                                puVar42 = sendbuf->base;
                                sVar45 = sendbuf->off;
                                puVar42[sVar45 + 2] = '\0';
                                puVar42 = puVar42 + sVar45;
                                puVar42[0] = '\0';
                                puVar42[1] = '\0';
                                sVar45 = sendbuf->off;
                                sendbuf->off = sVar45 + 3;
                                lVar37 = -3;
                                do {
                                  sendbuf->base[lVar37 + 3 + sVar45] = '\0';
                                  lVar37 = lVar37 + 1;
                                } while (lVar37 != 0);
                                psVar38 = tls->key_schedule;
                                puVar42 = sendbuf->base;
                                sVar45 = sendbuf->off;
                                if ((psVar38 != (st_ptls_key_schedule_t *)0x0) &&
                                   (psVar38->num_hashes != 0)) {
                                  puVar42 = local_2d0 + (long)puVar42;
                                  sVar45 = sVar45 - (long)local_2d0;
                                  pppVar30 = &psVar38->hashes[0].ctx;
                                  sVar31 = 0;
                                  do {
                                    (*(*pppVar30)->update)(*pppVar30,puVar42,sVar45);
                                    sVar31 = sVar31 + 1;
                                    pppVar30 = pppVar30 + 2;
                                  } while (sVar31 != psVar38->num_hashes);
                                  puVar42 = sendbuf->base;
                                  sVar45 = sendbuf->off;
                                }
                                puVar42[local_298] = (uint8_t)(sVar45 - (long)local_2d0 >> 8);
                                sendbuf->base[local_298 + 1] = (uint8_t)(sVar45 - (long)local_2d0);
                                local_330 = buffer_encrypt_record(sendbuf,sVar44,local_280);
                                if (local_330 == 0) goto LAB_0019d51f;
                              }
                            }
                          }
                        }
                      }
                      else {
LAB_0019d51f:
                        local_330 = retire_early_data_secret(tls,1);
                        if (local_330 == 0) goto LAB_0019d534;
                      }
                    }
                  }
                }
                (*ptls_clear_memory)(local_238,0x40);
                goto LAB_0019d6db;
              }
              break;
            case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
            case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
              local_330 = 0x28;
              if ((uVar32 == sVar39) && (uVar46 == '\x01')) {
                message.len = sVar39;
                message.base = puVar47;
                local_330 = server_handle_hello(tls,sendbuf,message,properties);
                goto LAB_0019d6db;
              }
              break;
            case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
              if (uVar46 != '\x05') break;
              local_330 = retire_early_data_secret(tls,0);
              if (local_330 != 0) goto LAB_0019d6db;
              psVar38 = tls->key_schedule;
              local_330 = 0x202;
              aVar21 = PTLS_STATE_SERVER_EXPECT_FINISHED;
              if (psVar38->num_hashes != 0) {
                pppVar30 = &psVar38->hashes[0].ctx;
                sVar44 = 0;
                do {
                  (*(*pppVar30)->update)(*pppVar30,puVar47,sVar39);
                  sVar44 = sVar44 + 1;
                  pppVar30 = pppVar30 + 2;
                } while (sVar44 != psVar38->num_hashes);
                aVar21 = PTLS_STATE_SERVER_EXPECT_FINISHED;
              }
LAB_0019ceeb:
              tls->state = aVar21;
              goto LAB_0019d6f6;
            case PTLS_STATE_SERVER_EXPECT_FINISHED:
              local_330 = 0x28;
              if ((uVar32 == sVar39) && (uVar46 == '\x14')) {
                message_00.len = sVar39;
                message_00.base = puVar47;
                local_330 = verify_finished(tls,message_00);
                if (local_330 == 0) {
                  uVar10 = *(undefined8 *)local_290;
                  uVar11 = *(undefined8 *)((long)local_290 + 8);
                  ppVar12 = (local_290->client).key_share_ctx;
                  p_Var5 = (local_290->client).certificate_verify.cb;
                  pvVar13 = (local_290->client).certificate_verify.verify_ctx;
                  uVar14 = *(undefined8 *)((long)local_290 + 0x28);
                  uVar15 = *(undefined8 *)((long)local_290 + 0x38);
                  *(undefined8 *)((tls->traffic_protection).dec.secret + 0x30) =
                       *(undefined8 *)((long)local_290 + 0x30);
                  *(undefined8 *)((tls->traffic_protection).dec.secret + 0x38) = uVar15;
                  *(void **)((tls->traffic_protection).dec.secret + 0x20) = pvVar13;
                  *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar14;
                  *(ptls_key_exchange_context_t **)((tls->traffic_protection).dec.secret + 0x10) =
                       ppVar12;
                  *(_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **)
                   ((tls->traffic_protection).dec.secret + 0x18) = p_Var5;
                  *(undefined8 *)(tls->traffic_protection).dec.secret = uVar10;
                  *(undefined8 *)((tls->traffic_protection).dec.secret + 8) = uVar11;
                  (*ptls_clear_memory)(local_290,0x40);
                  local_330 = setup_traffic_protection(tls,0,(char *)0x0,"CLIENT_TRAFFIC_SECRET_0");
                  if (local_330 == 0) {
                    psVar38 = tls->key_schedule;
                    local_330 = 0;
                    if (psVar38->num_hashes != 0) {
                      pppVar30 = &psVar38->hashes[0].ctx;
                      sVar44 = 0;
                      do {
                        (*(*pppVar30)->update)(*pppVar30,puVar47,sVar39);
                        sVar44 = sVar44 + 1;
                        pppVar30 = pppVar30 + 2;
                      } while (sVar44 != psVar38->num_hashes);
                    }
                    aVar21 = PTLS_STATE_SERVER_POST_HANDSHAKE;
                    goto LAB_0019ceeb;
                  }
                }
                goto LAB_0019d6db;
              }
              break;
            case PTLS_STATE_CLIENT_POST_HANDSHAKE:
              if (uVar46 == '\x04') {
                local_330 = decode_new_session_ticket
                                      ((uint32_t *)&local_2f8,&local_24c,&local_268,
                                       (ptls_iovec_t *)local_238,&local_250,puVar47 + 4,
                                       puVar47 + sVar39);
                if (local_330 == 0) {
                  if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
                    local_330 = 0;
                  }
                  else {
                    local_2e8 = 0;
                    local_2f8.len = 0x200;
                    local_2f8.base = local_238;
                    local_2e0 = 0;
                    psVar6 = tls->ctx->get_time;
                    uVar23 = (*psVar6->cb)(psVar6);
                    local_330 = ptls_buffer_reserve((ptls_buffer_t *)&local_2f8,8);
                    sVar44 = local_2e8;
                    puVar42 = local_2f8.base;
                    if (local_330 == 0) {
                      *(uint64_t *)(local_2f8.base + local_2e8) =
                           uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                           (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                           (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                           (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
                      local_2e8 = local_2e8 + 8;
                      uVar18 = tls->key_share->id;
                      local_330 = ptls_buffer_reserve((ptls_buffer_t *)&local_2f8,2);
                      sVar44 = local_2e8;
                      puVar42 = local_2f8.base;
                      if (local_330 == 0) {
                        *(ushort *)(local_2f8.base + local_2e8) = uVar18 << 8 | uVar18 >> 8;
                        local_2e8 = local_2e8 + 2;
                        uVar18 = tls->cipher_suite->id;
                        local_330 = ptls_buffer_reserve((ptls_buffer_t *)&local_2f8,2);
                        sVar44 = local_2e8;
                        puVar42 = local_2f8.base;
                        if (local_330 == 0) {
                          *(ushort *)(local_2f8.base + local_2e8) = uVar18 << 8 | uVar18 >> 8;
                          local_2e8 = local_2e8 + 2;
                          local_330 = ptls_buffer_reserve((ptls_buffer_t *)&local_2f8,3);
                          sVar45 = local_2e8;
                          sVar44 = local_2e8;
                          puVar42 = local_2f8.base;
                          if (local_330 == 0) {
                            local_2f8.base[local_2e8 + 2] = '\0';
                            (local_2f8.base + local_2e8)[0] = '\0';
                            (local_2f8.base + local_2e8)[1] = '\0';
                            sVar31 = local_2e8 + 3;
                            local_2e8 = sVar31;
                            local_330 = ptls_buffer__do_pushv
                                                  ((ptls_buffer_t *)&local_2f8,puVar47 + 4,uVar43);
                            sVar44 = local_2e8;
                            puVar42 = local_2f8.base;
                            if (local_330 == 0) {
                              uVar32 = local_2e8 - sVar31;
                              bVar17 = 0x10;
                              lVar37 = 0;
                              do {
                                auVar49._8_4_ = (int)lVar37;
                                auVar49._0_8_ = lVar37;
                                auVar49._12_4_ = (int)((ulong)lVar37 >> 0x20);
                                auVar49 = (auVar49 | _DAT_001b6f00) ^ _DAT_001b78d0;
                                if (auVar49._4_4_ == local_248._0_4_ && auVar49._0_4_ < -0x7ffffffd)
                                {
                                  local_2f8.base[lVar37 + sVar45] =
                                       (uint8_t)(uVar32 >> (bVar17 & 0x3f));
                                  local_2f8.base[lVar37 + sVar45 + 1] =
                                       (uint8_t)(uVar32 >> (bVar17 - 8 & 0x3f));
                                }
                                lVar37 = lVar37 + 2;
                                bVar17 = bVar17 - 0x10;
                              } while (lVar37 != 4);
                              local_330 = ptls_buffer_reserve((ptls_buffer_t *)&local_2f8,2);
                              sVar45 = local_2e8;
                              sVar44 = local_2e8;
                              puVar42 = local_2f8.base;
                              if (local_330 == 0) {
                                (local_2f8.base + local_2e8)[0] = '\0';
                                (local_2f8.base + local_2e8)[1] = '\0';
                                sVar31 = local_2e8 + 2;
                                local_2e8 = sVar31;
                                local_330 = ptls_buffer_reserve((ptls_buffer_t *)&local_2f8,
                                                                (tls->key_schedule->hashes[0].algo)
                                                                ->digest_size);
                                sVar44 = local_2e8;
                                puVar42 = local_2f8.base;
                                if ((local_330 == 0) &&
                                   (nonce.len = local_268.len, nonce.base = local_268.base,
                                   local_330 = derive_resumption_secret
                                                         (tls->key_schedule,
                                                          local_2f8.base + local_2e8,nonce),
                                   local_330 == 0)) {
                                  sVar44 = sVar44 + (tls->key_schedule->hashes[0].algo)->digest_size
                                  ;
                                  uVar18 = (short)sVar44 - (short)sVar31;
                                  *(ushort *)(puVar42 + sVar45) = uVar18 * 0x100 | uVar18 >> 8;
                                  psVar8 = tls->ctx->save_ticket;
                                  pVar53.len = sVar44;
                                  pVar53.base = puVar42;
                                  local_330 = (*psVar8->cb)(psVar8,tls,pVar53);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    (*ptls_clear_memory)(puVar42,sVar44);
                    if (local_2e0 != 0) {
                      free(puVar42);
                    }
                  }
                }
                goto LAB_0019d6db;
              }
              break;
            case PTLS_STATE_SERVER_POST_HANDSHAKE:
              break;
            }
            goto switchD_0019c577_caseD_c;
          }
        }
LAB_0019c46a:
        ppVar1 = local_288;
        ppVar41 = local_2c8;
        if (puVar47 == local_2c0) {
          ptls_buffer__release_memory(local_288);
          ppVar1->off = 0;
          ppVar1->is_allocated = 0;
          *(undefined4 *)&ppVar1->field_0x1c = 0;
          ppVar1->base = (uint8_t *)0x0;
          ppVar1->capacity = 0;
          ppVar41 = local_2c8;
        }
        else {
          if (local_288->base == (uint8_t *)0x0) {
            (tls->recvbuf).mess.base = "";
            delta = (long)local_2c0 - (long)puVar47;
            (tls->recvbuf).mess.capacity = 0;
            (tls->recvbuf).mess.off = 0;
            (tls->recvbuf).mess.is_allocated = 0;
            local_330 = ptls_buffer_reserve(local_288,delta);
            if (local_330 != 0) goto LAB_0019dde2;
            memcpy(ppVar1->base,puVar47,delta);
          }
          else {
            delta = (long)local_2c0 - (long)puVar47;
            memmove(local_288->base,puVar47,delta);
          }
          (tls->recvbuf).mess.off = delta;
          local_330 = 0x202;
        }
      }
    }
  }
LAB_0019dde2:
  ptls_buffer__release_memory(ppVar41);
  ppVar41->off = 0;
  ppVar41->is_allocated = 0;
  *(undefined4 *)&ppVar41->field_0x1c = 0;
  ppVar41->base = (uint8_t *)0x0;
  ppVar41->capacity = 0;
  return local_330;
LAB_0019d75f:
  if (puVar22 == puVar24) {
    local_330 = 0x32;
    apuStack_200[2] = (uint8_t *)sVar44;
    if (puVar24 != puVar42) goto LAB_0019c622;
    lVar37 = 0;
    goto LAB_0019db0c;
  }
  if ((long)puVar24 - (long)puVar22 < 2) goto LAB_0019d33a;
  uVar46 = *puVar22;
  bVar4 = puVar22[1];
  uVar18 = CONCAT11(uVar46,bVar4);
  if (uVar18 < 0x40) {
    if ((*(byte *)((long)&local_268.base + (ulong)(uVar18 >> 3)) >> (uVar18 & 7) & 1) != 0)
    goto LAB_0019cf57;
    pbVar3 = (byte *)((long)&local_268.base + (ulong)(bVar4 >> 3));
    *pbVar3 = *pbVar3 | '\x01' << (bVar4 & 7);
  }
  if ((ulong)((long)puVar24 - (long)(puVar22 + 2)) < 2) goto LAB_0019d33a;
  uVar18 = *(ushort *)(puVar22 + 2) << 8 | *(ushort *)(puVar22 + 2) >> 8;
  if ((ulong)((long)puVar24 - (long)(puVar22 + 4)) < (ulong)uVar18) goto LAB_0019d33a;
  puVar27 = puVar22 + 4 + uVar18;
  uVar19 = CONCAT11(uVar46,bVar4);
  puVar33 = puVar27;
  if (uVar19 < 0x2c) {
    if (uVar19 == 0x29) {
      if (!bVar9) goto LAB_0019cf57;
      if (uVar18 < 2) goto LAB_0019d33a;
      local_2fa = *(ushort *)(puVar22 + 4) << 8 | *(ushort *)(puVar22 + 4) >> 8;
    }
    else {
      if (uVar19 != 0x2b) goto LAB_0019d99f;
      if (uVar18 < 2) goto LAB_0019d33a;
      local_298 = CONCAT62(local_298._2_6_,
                           *(ushort *)(puVar22 + 4) << 8 | *(ushort *)(puVar22 + 4) >> 8);
    }
LAB_0019d99b:
    puVar33 = puVar22 + 6;
  }
  else if (uVar19 == 0x2c) {
    if (bVar9) goto LAB_0019cf57;
    if (uVar18 < 2) goto LAB_0019d33a;
    uVar32 = (ulong)(ushort)(*(ushort *)(puVar22 + 4) << 8 | *(ushort *)(puVar22 + 4) >> 8);
    local_2d0 = puVar22 + 6;
    if (((ulong)((long)puVar27 - (long)local_2d0) <= uVar32 - 1) ||
       (apuStack_200[1] = local_2d0, puVar22 + uVar32 + 6 != puVar27)) goto LAB_0019d33a;
    sVar44 = (long)(puVar22 + uVar32 + 6) - (long)local_2d0;
  }
  else if (uVar19 == 0x33) {
    if (!bVar9) {
      if (1 < uVar18) {
        apuStack_200[0]._0_2_ = *(ushort *)(puVar22 + 4) << 8 | *(ushort *)(puVar22 + 4) >> 8;
        goto LAB_0019d99b;
      }
      goto LAB_0019d33a;
    }
    if ((uVar18 < 2) || (puVar27 + (-6 - (long)puVar22) < (uint8_t *)0x2)) goto LAB_0019d33a;
    puVar2 = puVar22 + 8;
    local_2d0 = (uint8_t *)
                (ulong)(ushort)(*(ushort *)(puVar22 + 6) << 8 | *(ushort *)(puVar22 + 6) >> 8);
    if (puVar27 + -(long)puVar2 < local_2d0) goto LAB_0019d33a;
    apuStack_200[0] = puVar2;
    apuStack_200[1] = local_2d0;
    if (puVar2 + (long)local_2d0 != puVar27) goto LAB_0019d33a;
    local_330 = 0x2f;
    if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) ||
       (tls->key_share->id !=
        (uint16_t)(*(ushort *)(puVar22 + 4) << 8 | *(ushort *)(puVar22 + 4) >> 8)))
    goto LAB_0019c622;
  }
LAB_0019d99f:
  puVar22 = puVar27;
  if (puVar33 != puVar27) goto LAB_0019d33a;
  goto LAB_0019d75f;
  while (lVar37 = lVar37 + 2, lVar37 != 6) {
LAB_0019db0c:
    if (*(short *)((long)supported_versions + lVar37) == (short)local_298) {
      if (bVar9) {
        if (local_2fa != 0xffff) {
          if ((local_2fa != 0) || (((tls->field_15).server.pending_traffic_secret[0x28] & 1) == 0))
          break;
          tls->field_0x138 = tls->field_0x138 | 2;
        }
        if (apuStack_200[0] != (uint8_t *)0x0) goto LAB_0019dbb5;
        if ((bVar17 != 0x10) || ((tls->field_0x138 & 2) == 0)) break;
        auVar49 = *(undefined1 (*) [16])local_218.base;
        auVar52[0] = -((local_290->client).legacy_session_id[0] == auVar49[0]);
        auVar52[1] = -((local_290->client).legacy_session_id[1] == auVar49[1]);
        auVar52[2] = -((local_290->client).legacy_session_id[2] == auVar49[2]);
        auVar52[3] = -((local_290->client).legacy_session_id[3] == auVar49[3]);
        auVar52[4] = -((local_290->client).legacy_session_id[4] == auVar49[4]);
        auVar52[5] = -((local_290->client).legacy_session_id[5] == auVar49[5]);
        auVar52[6] = -((local_290->client).legacy_session_id[6] == auVar49[6]);
        auVar52[7] = -((local_290->client).legacy_session_id[7] == auVar49[7]);
        auVar52[8] = -((local_290->client).legacy_session_id[8] == auVar49[8]);
        auVar52[9] = -((local_290->client).legacy_session_id[9] == auVar49[9]);
        auVar52[10] = -((local_290->client).legacy_session_id[10] == auVar49[10]);
        auVar52[0xb] = -((local_290->client).legacy_session_id[0xb] == auVar49[0xb]);
        auVar52[0xc] = -((local_290->client).legacy_session_id[0xc] == auVar49[0xc]);
        auVar52[0xd] = -((local_290->client).legacy_session_id[0xd] == auVar49[0xd]);
        auVar52[0xe] = -((local_290->client).legacy_session_id[0xe] == auVar49[0xe]);
        auVar52[0xf] = -((local_290->client).legacy_session_id[0xf] == auVar49[0xf]);
        local_330 = 0x2f;
        if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar52[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0019c622;
        psVar38 = tls->key_schedule;
      }
      else {
LAB_0019dbb5:
        if (bVar17 != 0x10) break;
        auVar49 = *(undefined1 (*) [16])local_218.base;
        auVar51[0] = -((local_290->client).legacy_session_id[0] == auVar49[0]);
        auVar51[1] = -((local_290->client).legacy_session_id[1] == auVar49[1]);
        auVar51[2] = -((local_290->client).legacy_session_id[2] == auVar49[2]);
        auVar51[3] = -((local_290->client).legacy_session_id[3] == auVar49[3]);
        auVar51[4] = -((local_290->client).legacy_session_id[4] == auVar49[4]);
        auVar51[5] = -((local_290->client).legacy_session_id[5] == auVar49[5]);
        auVar51[6] = -((local_290->client).legacy_session_id[6] == auVar49[6]);
        auVar51[7] = -((local_290->client).legacy_session_id[7] == auVar49[7]);
        auVar51[8] = -((local_290->client).legacy_session_id[8] == auVar49[8]);
        auVar51[9] = -((local_290->client).legacy_session_id[9] == auVar49[9]);
        auVar51[10] = -((local_290->client).legacy_session_id[10] == auVar49[10]);
        auVar51[0xb] = -((local_290->client).legacy_session_id[0xb] == auVar49[0xb]);
        auVar51[0xc] = -((local_290->client).legacy_session_id[0xc] == auVar49[0xc]);
        auVar51[0xd] = -((local_290->client).legacy_session_id[0xd] == auVar49[0xd]);
        auVar51[0xe] = -((local_290->client).legacy_session_id[0xe] == auVar49[0xe]);
        auVar51[0xf] = -((local_290->client).legacy_session_id[0xf] == auVar49[0xf]);
        local_330 = 0x2f;
        if ((ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar51[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0019c622;
        psVar38 = tls->key_schedule;
        if (!bVar9) {
          local_330 = key_schedule_select_one(psVar38,cs,0);
          if (local_330 != 0) goto LAB_0019c622;
          message_02.len = sVar39;
          message_02.base = puVar47;
          local_330 = handle_hello_retry_request
                                (tls,sendbuf,(st_ptls_server_hello_t *)local_238,message_02,
                                 properties);
          goto LAB_0019d6db;
        }
      }
      uVar20 = 0;
      if (((tls->field_15).server.pending_traffic_secret[0x28] & 1) != 0) {
        uVar20 = (uint)((tls->field_0x138 & 2) == 0);
      }
      local_330 = key_schedule_select_one(psVar38,cs,uVar20);
      if ((local_330 == 0) &&
         ((apuStack_200[0] == (uint8_t *)0x0 ||
          (local_330 = (**(code **)*local_258)(), local_330 == 0)))) {
        psVar38 = tls->key_schedule;
        if (psVar38->num_hashes != 0) {
          pppVar30 = &psVar38->hashes[0].ctx;
          sVar44 = 0;
          do {
            (*(*pppVar30)->update)(*pppVar30,puVar47,sVar39);
            sVar44 = sVar44 + 1;
            pppVar30 = pppVar30 + 2;
          } while (sVar44 != psVar38->num_hashes);
          psVar38 = tls->key_schedule;
        }
        local_330 = key_schedule_extract(psVar38,local_2f8);
        if ((local_330 == 0) &&
           (local_330 = setup_traffic_protection
                                  (tls,0,"s hs traffic","SERVER_HANDSHAKE_TRAFFIC_SECRET"),
           local_330 == 0)) {
          tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
          local_330 = 0x202;
        }
      }
      goto LAB_0019c622;
    }
  }
LAB_0019cf57:
  local_330 = 0x2f;
LAB_0019c622:
  if (local_2f8.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(local_2f8.base,local_2f8.len);
    free(local_2f8.base);
  }
LAB_0019d6db:
  if ((local_330 != 0) && (local_330 != 0x202)) {
switchD_0019c577_caseD_c:
    ppVar41 = local_288;
    ptls_buffer__release_memory(local_288);
    ppVar41->off = 0;
    ppVar41->is_allocated = 0;
    *(undefined4 *)&ppVar41->field_0x1c = 0;
    ppVar41->base = (uint8_t *)0x0;
    ppVar41->capacity = 0;
    ppVar41 = local_2c8;
    goto LAB_0019dde2;
  }
LAB_0019d6f6:
  puVar47 = puVar47 + sVar39;
  uVar32 = (long)local_2c0 - (long)puVar47;
  if ((long)uVar32 < 4) goto LAB_0019c46a;
  uVar29 = (ulong)((uint)puVar47[2] << 8 | (uint)puVar47[1] << 0x10);
  uVar43 = uVar29 + puVar47[3];
  sVar39 = uVar29 + puVar47[3] + 4;
  if (uVar32 < sVar39) goto LAB_0019c46a;
  goto LAB_0019c555;
LAB_0019d33a:
  local_330 = 0x32;
  goto LAB_0019c622;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &rec.length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->skip_early_data) {
                ret = PTLS_ERROR_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->skip_early_data) {
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, handle_handshake_message, sendbuf, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}